

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_object.cpp
# Opt level: O1

void mjs::anon_unknown_33::make_immutable(object_ptr *o,property_attribute attr)

{
  bool bVar1;
  property_attribute attributes;
  object *this;
  long *plVar2;
  uint *puVar3;
  undefined8 *puVar4;
  void *pvVar5;
  gc_heap_ptr_untyped *this_00;
  ulong local_80;
  uint *local_78;
  value local_70;
  vector<mjs::string,_std::allocator<mjs::string>_> local_48;
  
  this = (object *)gc_heap_ptr_untyped::get(&o->super_gc_heap_ptr_untyped);
  object::own_property_names(&local_48,this,false);
  for (this_00 = (gc_heap_ptr_untyped *)
                 local_48.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
                 super__Vector_impl_data._M_start;
      this_00 !=
      (gc_heap_ptr_untyped *)
      local_48.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
      super__Vector_impl_data._M_finish; this_00 = this_00 + 1) {
    plVar2 = (long *)gc_heap_ptr_untyped::get(&o->super_gc_heap_ptr_untyped);
    puVar3 = (uint *)gc_heap_ptr_untyped::get(this_00);
    local_70.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
         (gc_heap *)(puVar3 + 1);
    local_70._0_8_ = ZEXT48(*puVar3);
    attributes = (**(code **)(*plVar2 + 0x30))(plVar2,&local_70);
    bVar1 = has_attributes(attributes,attr);
    if (!bVar1) {
      plVar2 = (long *)gc_heap_ptr_untyped::get(&o->super_gc_heap_ptr_untyped);
      puVar4 = (undefined8 *)gc_heap_ptr_untyped::get(&o->super_gc_heap_ptr_untyped);
      puVar3 = (uint *)gc_heap_ptr_untyped::get(this_00);
      local_78 = puVar3 + 1;
      local_80 = (ulong)*puVar3;
      (**(code **)*puVar4)(&local_70,puVar4,&local_80);
      (**(code **)(*plVar2 + 0x28))(plVar2,this_00,&local_70,attributes | attr);
      value::destroy(&local_70);
    }
  }
  std::vector<mjs::string,_std::allocator<mjs::string>_>::~vector(&local_48);
  pvVar5 = gc_heap_ptr_untyped::get(&o->super_gc_heap_ptr_untyped);
  *(undefined1 *)((long)pvVar5 + 0x1c) = 0;
  return;
}

Assistant:

void make_immutable(const object_ptr& o, property_attribute attr) {
    for (const auto& p : o->own_property_names(false)) {
        const auto attrs = o->own_property_attributes(p.view());
        if (!has_attributes(attrs, attr)) {
            o->redefine_own_property(p, o->get(p.view()), attrs | attr);
        }
    }
    o->prevent_extensions();
}